

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable_suite.cpp
# Opt level: O2

void ctor_suite::run(void)

{
  construct_null();
  construct_boolean();
  construct_signed_char();
  construct_unsigned_char();
  construct_signed_short_int();
  construct_unsigned_short_int();
  construct_signed_int();
  construct_unsigned_int();
  construct_signed_long_int();
  construct_unsigned_long_int();
  construct_signed_long_long_int();
  construct_unsigned_long_long_int();
  construct_float();
  construct_double();
  construct_long_double();
  construct_string();
  construct_wstring();
  construct_u16string();
  construct_u32string();
  construct_array_empty();
  construct_array_from_vector();
  construct_array_from_iterator();
  construct_array_from_factory();
  construct_array_from_initializer();
  construct_array_from_nested_initializer();
  construct_array_from_size();
  construct_map_empty();
  construct_map_key_null();
  construct_map_key_boolean();
  construct_map_key_integer();
  construct_map_key_string();
  construct_map_from_implicit_pair();
  construct_map_from_explicit_pair();
  construct_map_from_make_pair();
  construct_map_with_nested_array();
  construct_map_with_nested_map();
  construct_no_map();
  construct_from_array();
  construct_from_map();
  return;
}

Assistant:

void run()
{
    construct_null();

    construct_boolean();

    construct_signed_char();
    construct_unsigned_char();
    construct_signed_short_int();
    construct_unsigned_short_int();
    construct_signed_int();
    construct_unsigned_int();
    construct_signed_long_int();
    construct_unsigned_long_int();
    construct_signed_long_long_int();
    construct_unsigned_long_long_int();

    construct_float();
    construct_double();
    construct_long_double();

    construct_string();
    construct_wstring();
    construct_u16string();
    construct_u32string();

    construct_array_empty();
    construct_array_from_vector();
    construct_array_from_iterator();
    construct_array_from_factory();
    construct_array_from_initializer();
    construct_array_from_nested_initializer();
    construct_array_from_size();

    construct_map_empty();
    construct_map_key_null();
    construct_map_key_boolean();
    construct_map_key_integer();
    construct_map_key_string();
    construct_map_from_implicit_pair();
    construct_map_from_explicit_pair();
    construct_map_from_make_pair();
    construct_map_with_nested_array();
    construct_map_with_nested_map();

    construct_no_map();

    construct_from_array();
    construct_from_map();
}